

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O2

bool __thiscall MT32Emu::Poly::noteOff(Poly *this,bool pedalHeld)

{
  bool bVar1;
  
  if ((this->state & ~POLY_Held) == POLY_Releasing) {
LAB_00165c22:
    bVar1 = false;
  }
  else {
    if (pedalHeld) {
      if (this->state == POLY_Held) goto LAB_00165c22;
      setState(this,POLY_Held);
    }
    else {
      startDecay(this);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Poly::noteOff(bool pedalHeld) {
	// Generally, non-sustaining instruments ignore note off. They die away eventually anyway.
	// Key 0 (only used by special cases on rhythm part) reacts to note off even if non-sustaining or pedal held.
	if (state == POLY_Inactive || state == POLY_Releasing) {
		return false;
	}
	if (pedalHeld) {
		if (state == POLY_Held) {
			return false;
		}
		setState(POLY_Held);
	} else {
		startDecay();
	}
	return true;
}